

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

int check_skip_mode_enabled(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  int ref_frame [2];
  int cur_to_ref1;
  int cur_to_ref0;
  int ref_offset [2];
  int cur_offset;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int local_4;
  
  av1_setup_skip_mode_allowed(cm);
  if (*(int *)(in_RDI + 0x3bf94) == 0) {
    local_4 = 0;
  }
  else {
    iVar2 = *(int *)(in_RDI + 0x3bf84);
    get_skip_mode_ref_offsets
              ((AV1_COMMON *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
               (int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    iVar1 = get_relative_dist((OrderHintInfo *)(*(long *)(in_RDI + 0x42008) + 0x28),iVar2,
                              in_stack_ffffffffffffffdc);
    iVar2 = get_relative_dist((OrderHintInfo *)(*(long *)(in_RDI + 0x42008) + 0x28),iVar2,
                              in_stack_ffffffffffffffe0);
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    iVar1 = iVar1 - iVar2;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    if (iVar1 < 2) {
      if ((*(int *)(in_RDI + 0x71290) == 0) || (*(int *)(in_RDI + 0x42450) < 1)) {
        if (((*(uint *)(in_RDI + 0x608b8) & (uint)""[*(int *)(in_RDI + 0x3bf9c) + 1]) == 0) ||
           ((*(uint *)(in_RDI + 0x608b8) & (uint)""[*(int *)(in_RDI + 0x3bfa0) + 1]) == 0)) {
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int check_skip_mode_enabled(AV1_COMP *const cpi) {
  AV1_COMMON *const cm = &cpi->common;

  av1_setup_skip_mode_allowed(cm);
  if (!cm->current_frame.skip_mode_info.skip_mode_allowed) return 0;

  // Turn off skip mode if the temporal distances of the reference pair to the
  // current frame are different by more than 1 frame.
  const int cur_offset = (int)cm->current_frame.order_hint;
  int ref_offset[2];
  get_skip_mode_ref_offsets(cm, ref_offset);
  const int cur_to_ref0 = get_relative_dist(&cm->seq_params->order_hint_info,
                                            cur_offset, ref_offset[0]);
  const int cur_to_ref1 = abs(get_relative_dist(
      &cm->seq_params->order_hint_info, cur_offset, ref_offset[1]));
  if (abs(cur_to_ref0 - cur_to_ref1) > 1) return 0;

  // High Latency: Turn off skip mode if all refs are fwd.
  if (cpi->all_one_sided_refs && cpi->oxcf.gf_cfg.lag_in_frames > 0) return 0;

  const int ref_frame[2] = {
    cm->current_frame.skip_mode_info.ref_frame_idx_0 + LAST_FRAME,
    cm->current_frame.skip_mode_info.ref_frame_idx_1 + LAST_FRAME
  };
  if (!(cpi->ref_frame_flags & av1_ref_frame_flag_list[ref_frame[0]]) ||
      !(cpi->ref_frame_flags & av1_ref_frame_flag_list[ref_frame[1]]))
    return 0;

  return 1;
}